

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffcpht(fitsfile *infptr,fitsfile *outfptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  LONGLONG in_RCX;
  char *in_RDX;
  fitsfile *in_RSI;
  int *in_R8;
  int *in_stack_00000048;
  fitsfile *in_stack_00000050;
  fitsfile *in_stack_00000058;
  int *in_stack_00000078;
  LONGLONG in_stack_00000080;
  LONGLONG in_stack_00000088;
  fitsfile *in_stack_00000090;
  fitsfile *in_stack_00000098;
  int *in_stack_000000d0;
  fitsfile *in_stack_000000d8;
  int *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  if (*in_R8 < 1) {
    ffcphd(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    if (*in_R8 == 0) {
      ffukyj(in_RSI,in_RDX,in_RCX,(char *)in_R8,in_stack_ffffffffffffffc8);
      ffukyj(in_RSI,in_RDX,in_RCX,(char *)in_R8,in_stack_ffffffffffffffc8);
      ffrdef(in_stack_000000d8,in_stack_000000d0);
    }
    if ((*in_R8 == 0) && (0 < in_RCX)) {
      ffcprw(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
             in_stack_00000078);
    }
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffcpht(fitsfile *infptr,    /* I - FITS file pointer to input file  */
	   fitsfile *outfptr,   /* I - FITS file pointer to output file */
           LONGLONG firstrow,   /* I - number of first row to copy (1 based)  */
	   LONGLONG nrows,      /* I - number of rows to copy  */
	   int *status)         /* IO - error status     */

/* 
   Copy the table structure from an existing table HDU, but only
   copy a limited row range.  All header keywords from the input
   table are copied directly, but NAXSI2 and PCOUNT are set to their
   correct values. 
*/
{
  if (*status > 0)
    return(*status);

  /* Copy the header only */
  ffcphd(infptr, outfptr, status);
  /* Note that we now have a copied header that describes the table,
     and that is the current header, but the original number of table
     rows and heap area sizes are still there. */

  /* Zero out the size-related keywords */
  if (! *status ) {
    ffukyj(outfptr,"NAXIS2",0,0,status); /* NAXIS2 = 0 */
    ffukyj(outfptr,"PCOUNT",0,0,status); /* PCOUNT = 0 */
    /* Update the internal structure variables within CFITSIO now
       that we have a valid table header */
    ffrdef(outfptr,status);
  }

  /* OK now that we have a pristine HDU, copy the requested rows */
  if (! *status && nrows > 0) {
    ffcprw(infptr, outfptr, firstrow, nrows, status);
  }
 
  return (*status);
}